

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall QtMWidgets::AbstractScrollArea::_q_animateScrollIndicators(AbstractScrollArea *this)

{
  int *piVar1;
  int iVar2;
  AbstractScrollAreaPrivate *this_00;
  ScrollIndicator *pSVar3;
  ScrollIndicator *pSVar4;
  
  this_00 = (this->d).d;
  iVar2 = this_00->animationAlphaDelta;
  pSVar3 = this_00->horIndicator;
  pSVar3->alpha = pSVar3->alpha - iVar2;
  pSVar4 = this_00->vertIndicator;
  piVar1 = &pSVar4->alpha;
  *piVar1 = *piVar1 - iVar2;
  if (pSVar3->alpha < 1) {
    AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(this_00);
  }
  else if ((pSVar3->needPaint != false) || (pSVar4->needPaint == true)) {
    QTimer::start((int)this_00->animationTimer);
  }
  if (((this->d).d)->horIndicator->needPaint == true) {
    QWidget::update();
  }
  if (((this->d).d)->vertIndicator->needPaint == true) {
    QWidget::update();
    return;
  }
  return;
}

Assistant:

void
AbstractScrollArea::_q_animateScrollIndicators()
{
	d->horIndicator->alpha -= d->animationAlphaDelta;
	d->vertIndicator->alpha -= d->animationAlphaDelta;

	if( d->horIndicator->alpha <= 0 )
		d->stopScrollIndicatorsAnimation();
	else if( d->horIndicator->needPaint || d->vertIndicator->needPaint )
		d->animationTimer->start( d->animationTimeout );

	if( d->horIndicator->needPaint )
		d->horIndicator->update();

	if( d->vertIndicator->needPaint )
		d->vertIndicator->update();
}